

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSNet.h
# Opt level: O2

int releaseudpcli(SOCKET sock)

{
  int iVar1;
  
  shutdown(sock,2);
  iVar1 = close(sock);
  return (int)(iVar1 != 0);
}

Assistant:

inline int releaseudpcli(SOCKET sock)
{
	// Shutdown the connection.
	if (shutdown(sock, SD_BOTH) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_WARNING_OSNET(("releaseudpcli warning (%s) : %s(sock=%d)\n", 
			strtime_m(), 
			"shutdown failed. ", 
			(int)sock));
		//return EXIT_FAILURE;
	}

	// Destroy the socket created by socket().
	if (closesocket(sock) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("releaseudpcli error (%s) : %s(sock=%d)\n", 
			strtime_m(), 
			"closesocket failed. ", 
			(int)sock));
		return EXIT_FAILURE;
	}

#ifdef _WIN32
	// Terminate use of the Winsock 2 DLL (WS2_32.dll).
	if (WSACleanup() != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("releaseudpcli error (%s) : %s(sock=%d)\n", 
			strtime_m(), 
			"WSACleanup failed. ", 
			(int)sock));
		return EXIT_FAILURE;
	}
#endif // _WIN32

	return EXIT_SUCCESS;
}